

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmCachePolicyCommon.cpp
# Opt level: O2

GMM_GFX_MEMORY_TYPE __thiscall
GmmLib::GmmCachePolicyCommon::GetWantedMemoryType
          (GmmCachePolicyCommon *this,GMM_CACHE_POLICY_ELEMENT CachePolicy)

{
  GMM_GFX_MEMORY_TYPE GVar1;
  
  GVar1 = GMM_GFX_WT;
  if (((undefined1  [40])CachePolicy & (undefined1  [40])0x8) == (undefined1  [40])0x0) {
    GVar1 = (uint)(((undefined1  [40])CachePolicy & (undefined1  [40])0x3) != (undefined1  [40])0x0)
            * 3;
  }
  return GVar1;
}

Assistant:

GMM_GFX_MEMORY_TYPE GmmLib::GmmCachePolicyCommon::GetWantedMemoryType(GMM_CACHE_POLICY_ELEMENT CachePolicy)
{
    GMM_GFX_MEMORY_TYPE WantedMemoryType = GMM_GFX_UC_WITH_FENCE;
    if(CachePolicy.WT)
    {
        WantedMemoryType = GMM_GFX_WT;
    }
    else if(!(CachePolicy.LLC || CachePolicy.ELLC))
    {
        WantedMemoryType = GMM_GFX_UC_WITH_FENCE;
    }
    else
    {
        WantedMemoryType = GMM_GFX_WB;
    }
    return WantedMemoryType;
}